

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall Js::InterpreterStackFrame::NewScopeObject(InterpreterStackFrame *this)

{
  Type TVar1;
  bool bVar2;
  uint index;
  PropertyIdArray *propIds_00;
  JavascriptFunction *varFunc;
  FunctionBody *this_00;
  Type *literalType;
  ScriptContext *pSVar3;
  PropertyId objectId;
  JavascriptFunction *funcExpr;
  PropertyIdArray *propIds;
  Var scopeObject;
  InterpreterStackFrame *this_local;
  
  bVar2 = FunctionBody::HasCachedScopePropIds(*(FunctionBody **)(this + 0x88));
  if (bVar2) {
    propIds_00 = FunctionBody::GetFormalsPropIdArray(*(FunctionBody **)(this + 0x88),true);
    varFunc = GetFunctionExpression(this);
    index = ActivationObjectEx::GetLiteralObjectRef(propIds_00);
    this_00 = GetFunctionBody(this);
    literalType = FunctionBody::GetObjectLiteralTypeRef(this_00,index);
    TVar1 = propIds_00->hasNonSimpleParams;
    pSVar3 = GetScriptContext(this);
    propIds = (PropertyIdArray *)
              Js::JavascriptOperators::OP_InitCachedScope
                        (varFunc,propIds_00,literalType,(bool)(TVar1 & 1),pSVar3);
  }
  else {
    pSVar3 = GetScriptContext(this);
    propIds = (PropertyIdArray *)Js::JavascriptOperators::OP_NewScopeObject(pSVar3);
  }
  SetLocalClosure(this,propIds);
  return propIds;
}

Assistant:

Var
        InterpreterStackFrame::NewScopeObject()
    {
        Var scopeObject;

        if (m_functionBody->HasCachedScopePropIds())
        {
            const Js::PropertyIdArray *propIds = this->m_functionBody->GetFormalsPropIdArray();

            JavascriptFunction* funcExpr = this->GetFunctionExpression();
            PropertyId objectId = ActivationObjectEx::GetLiteralObjectRef(propIds);
            scopeObject = JavascriptOperators::OP_InitCachedScope(funcExpr, propIds,
                this->GetFunctionBody()->GetObjectLiteralTypeRef(objectId),
                propIds->hasNonSimpleParams, GetScriptContext());

        }
        else
        {
            scopeObject = JavascriptOperators::OP_NewScopeObject(GetScriptContext());
        }
        this->SetLocalClosure(scopeObject);
        return scopeObject;
    }